

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PrintTupleTo<std::tuple<double>,1ul>(tuple<double> *t,ostream *param_2)

{
  __tuple_element_t<0UL,_tuple<double>_> *value;
  ostream *os_local;
  tuple<double> *t_local;
  
  PrintTupleTo<std::tuple<double>>(t,param_2);
  value = std::get<0ul,double>(t);
  UniversalPrinter<double>::Print(value,param_2);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}